

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O1

size_t __thiscall soul::CodeLocation::getByteOffsetInFile(CodeLocation *this)

{
  SourceCodeText *pSVar1;
  size_t sVar2;
  
  pSVar1 = (this->sourceCode).object;
  if (pSVar1 == (SourceCodeText *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x47);
  }
  sVar2 = (long)(this->location).data - (long)(pSVar1->utf8).data;
  if (-1 < (long)sVar2) {
    return sVar2;
  }
  throwInternalCompilerError("diff >= 0","getByteOffsetInFile",0x5a);
}

Assistant:

size_t CodeLocation::getByteOffsetInFile() const
{
    auto diff = location.getAddress() - sourceCode->utf8.getAddress();
    SOUL_ASSERT (diff >= 0);
    return static_cast<size_t> (diff);
}